

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.cpp
# Opt level: O0

Type __thiscall
wasm::GlobalTypeRewriter::mapTypes(std::unordered_map<wasm::HeapType,wasm::HeapType,std::hash<wasm::
HeapType>,std::equal_to<wasm::HeapType>,std::allocator<std::pair<wasm::HeapType_const,wasm::
HeapType>>>const&)::CodeUpdater::getNew(wasm::Type_(void *this,Type type)

{
  bool bVar1;
  HeapType heapType;
  Tuple *__x;
  reference pTVar2;
  Type TVar3;
  Type *t;
  iterator __end3;
  iterator __begin3;
  Tuple *__range3;
  Tuple tuple;
  CodeUpdater *this_local;
  Type type_local;
  
  this_local = (CodeUpdater *)type.id;
  bVar1 = wasm::Type::isRef((Type *)&this_local);
  if (bVar1) {
    tuple.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)wasm::Type::getHeapType((Type *)&this_local);
    heapType = HeapType_(this,(HeapType)
                              tuple.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
    type_local = wasm::Type::with((Type *)&this_local,heapType);
  }
  else {
    bVar1 = wasm::Type::isTuple((Type *)&this_local);
    if (bVar1) {
      __x = wasm::Type::getTuple((Type *)&this_local);
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&__range3,__x);
      __end3 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::begin
                         ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&__range3);
      t = (Type *)std::vector<wasm::Type,_std::allocator<wasm::Type>_>::end
                            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&__range3);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end3,(__normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
                                    *)&t);
        if (!bVar1) break;
        pTVar2 = __gnu_cxx::
                 __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
                 ::operator*(&__end3);
        TVar3 = Type_(this,pTVar2->id);
        pTVar2->id = TVar3.id;
        __gnu_cxx::
        __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>::
        operator++(&__end3);
      }
      wasm::Type::Type(&type_local,(Tuple *)&__range3);
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&__range3);
    }
    else {
      type_local.id = (uintptr_t)this_local;
    }
  }
  return (Type)type_local.id;
}

Assistant:

Type getNew(Type type) {
      if (type.isRef()) {
        return type.with(getNew(type.getHeapType()));
      }
      if (type.isTuple()) {
        auto tuple = type.getTuple();
        for (auto& t : tuple) {
          t = getNew(t);
        }
        return Type(tuple);
      }
      return type;
    }